

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O3

SimpleString __thiscall MemoryAccountant::report(MemoryAccountant *this)

{
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar1;
  long lVar2;
  long *in_RSI;
  char *pcVar3;
  SimpleString *rhs;
  SimpleString SVar4;
  SimpleString accountantReport;
  SimpleString local_60;
  undefined1 local_50 [32];
  
  if (*in_RSI == 0) {
    SimpleString::SimpleString
              ((SimpleString *)this,
               "CppUTest Memory Accountant has not noticed any allocations or deallocations. Sorry\n"
              );
    sVar1 = extraout_RDX_00;
  }
  else {
    pcVar3 = "CppUTest Memory Accountant report:\n";
    if ((char)in_RSI[2] != '\0') {
      pcVar3 = "CppUTest Memory Accountant report (with cache sizes):\n";
    }
    SimpleString::SimpleString(&local_60,pcVar3);
    pcVar3 = 
    "Allocation size     # allocations    # deallocations   max # allocations at one time\n";
    if ((char)in_RSI[2] != '\0') {
      pcVar3 = 
      "Cache size          # allocations    # deallocations   max # allocations at one time\n";
    }
    SimpleString::SimpleString((SimpleString *)local_50,pcVar3);
    rhs = &local_60;
    SimpleString::operator+((SimpleString *)(local_50 + 0x10),rhs);
    SimpleString::~SimpleString((SimpleString *)local_50);
    SimpleString::~SimpleString(&local_60);
    lVar2 = *in_RSI;
    if (lVar2 != 0) {
      do {
        stringSize((MemoryAccountant *)local_50,(size_t)rhs);
        pcVar3 = SimpleString::asCharString((SimpleString *)local_50);
        StringFromFormat((char *)&local_60,"%s               %5d            %5d             %5d\n",
                         pcVar3,(ulong)*(uint *)(lVar2 + 8),(ulong)*(uint *)(lVar2 + 0x10),
                         (ulong)*(uint *)(lVar2 + 0x18));
        rhs = &local_60;
        SimpleString::operator+=((SimpleString *)(local_50 + 0x10),&local_60);
        SimpleString::~SimpleString(&local_60);
        SimpleString::~SimpleString((SimpleString *)local_50);
        lVar2 = *(long *)(lVar2 + 0x28);
      } while (lVar2 != 0);
    }
    SimpleString::SimpleString(&local_60,"   Thank you for your business\n");
    SimpleString::operator+((SimpleString *)this,(SimpleString *)(local_50 + 0x10));
    SimpleString::~SimpleString(&local_60);
    SimpleString::~SimpleString((SimpleString *)(local_50 + 0x10));
    sVar1 = extraout_RDX;
  }
  SVar4.bufferSize_ = sVar1;
  SVar4.buffer_ = (char *)this;
  return SVar4;
}

Assistant:

SimpleString MemoryAccountant::report() const
{
    if (head_ == NULLPTR)
      return reportNoAllocations();

    SimpleString accountantReport = reportTitle() + reportHeader();

    for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_)
        accountantReport += StringFromFormat(MEMORY_ACCOUNTANT_ROW_FORMAT, stringSize(node->size_).asCharString(), (int) node->allocations_, (int) node->deallocations_, (int) node->maxAllocations_);

    return accountantReport + reportFooter();
}